

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_register_hrec(bcf_hdr_t *hdr,bcf_hrec_t *hrec)

{
  char cVar1;
  kh_vdict_t *pkVar2;
  bcf_idinfo_t *pbVar3;
  int iVar4;
  int iVar5;
  khint_t kVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  int j;
  int local_50;
  int ret;
  char *tmp;
  char *local_40;
  bcf_hdr_t *local_38;
  
  pcVar8 = hrec->key;
  iVar4 = strcmp(pcVar8,"contig");
  if (iVar4 == 0) {
    hrec->type = 3;
    uVar10 = bcf_hrec_find_key(hrec,"length");
    if ((int)uVar10 < 0) {
      j = 0;
    }
    else {
      iVar4 = __isoc99_sscanf(hrec->vals[uVar10],"%d",&j);
      if (iVar4 != 1) {
        return 0;
      }
    }
    uVar10 = bcf_hrec_find_key(hrec,"ID");
    if ((int)uVar10 < 0) {
      return 0;
    }
    pcVar8 = strdup(hrec->vals[uVar10]);
    pkVar2 = (kh_vdict_t *)hdr->dict[1];
    kVar6 = kh_put_vdict(pkVar2,pcVar8,&ret);
    if (ret == 0) {
      free(pcVar8);
      return 0;
    }
    iVar4 = bcf_hrec_find_key(hrec,"IDX");
    if (iVar4 == -1) {
      iVar4 = pkVar2->size - 1;
      hrec_add_idx(hrec,iVar4);
    }
    else {
      tmp = hrec->vals[iVar4];
      lVar7 = strtol(tmp,&tmp,10);
      iVar4 = (int)lVar7;
      if (*tmp != '\0') {
        uVar9 = 0x178;
LAB_00112227:
        fprintf(_stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                ,uVar9,"bcf_hdr_register_hrec");
        return 0;
      }
    }
    pbVar3 = pkVar2->vals;
    pbVar3[(int)kVar6].hrec[2] = (bcf_hrec_t *)0x0;
    (pbVar3[(int)kVar6].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
    pbVar3[(int)kVar6].hrec[0] = (bcf_hrec_t *)0x0;
    pbVar3[(int)kVar6].hrec[1] = (bcf_hrec_t *)0x0;
    pbVar3 = pbVar3 + (int)kVar6;
    pbVar3->info[0] = 0xf;
    pbVar3->info[1] = 0xf;
    *(undefined8 *)(pbVar3->info + 2) = 0xf;
    pbVar3 = pkVar2->vals;
    pbVar3[(int)kVar6].id = iVar4;
    pbVar3[(int)kVar6].info[0] = j;
    pbVar3[(int)kVar6].hrec[0] = hrec;
  }
  else {
    iVar4 = strcmp(pcVar8,"INFO");
    iVar5 = 1;
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar8,"FILTER");
      if (iVar4 == 0) {
        iVar5 = 0;
      }
      else {
        iVar4 = strcmp(pcVar8,"FORMAT");
        iVar5 = 2;
        if (iVar4 != 0) {
          if (0 < hrec->nkeys) {
            hrec->type = 4;
            return 1;
          }
          return 0;
        }
      }
    }
    hrec->type = iVar5;
    j = -1;
    iVar4 = -1;
    local_40 = (char *)0x0;
    local_50 = -1;
    lVar7 = 0xffffffff;
    local_38 = hdr;
    for (lVar12 = 0; lVar12 < hrec->nkeys; lVar12 = lVar12 + 1) {
      pcVar8 = hrec->keys[lVar12];
      if (((*pcVar8 == 'I') && (pcVar8[1] == 'D')) && (pcVar8[2] == '\0')) {
        local_40 = hrec->vals[lVar12];
      }
      else {
        iVar5 = strcmp(pcVar8,"IDX");
        if (iVar5 == 0) {
          tmp = hrec->vals[lVar12];
          lVar7 = strtol(tmp,&tmp,10);
          if (*tmp != '\0') {
            uVar9 = 0x19c;
            goto LAB_00112227;
          }
        }
        else {
          iVar5 = strcmp(pcVar8,"Type");
          if (iVar5 == 0) {
            pcVar8 = hrec->vals[lVar12];
            iVar4 = strcmp(pcVar8,"Integer");
            if (iVar4 == 0) {
              iVar4 = 1;
            }
            else {
              iVar4 = strcmp(pcVar8,"Float");
              if (iVar4 == 0) {
                iVar4 = 2;
              }
              else {
                iVar4 = strcmp(pcVar8,"String");
                if ((iVar4 != 0) && (iVar4 = strcmp(pcVar8,"Character"), iVar4 != 0)) {
                  iVar5 = strcmp(pcVar8,"Flag");
                  iVar4 = 0;
                  if (iVar5 == 0) goto LAB_00111f8f;
                  fprintf(_stderr,"[E::%s] The type \"%s\" not supported, assuming \"String\"\n",
                          "bcf_hdr_register_hrec",pcVar8);
                }
                iVar4 = 3;
              }
            }
          }
          else {
            iVar5 = strcmp(pcVar8,"Number");
            if (iVar5 == 0) {
              pcVar8 = hrec->vals[lVar12];
              cVar1 = *pcVar8;
              if (cVar1 == '.') {
                bVar13 = pcVar8[1] == '\0';
                local_50 = 1;
LAB_00111f63:
                if (bVar13) {
                  j = 0xfffff;
                  goto LAB_00111f8f;
                }
              }
              else {
                if (cVar1 == 'R') {
                  bVar13 = pcVar8[1] == '\0';
                  local_50 = 4;
                  goto LAB_00111f63;
                }
                if (cVar1 == 'G') {
                  bVar13 = pcVar8[1] == '\0';
                  local_50 = 3;
                  goto LAB_00111f63;
                }
                if (cVar1 == 'A') {
                  bVar13 = pcVar8[1] == '\0';
                  local_50 = 2;
                  goto LAB_00111f63;
                }
              }
              local_50 = 0;
              __isoc99_sscanf(pcVar8,"%d",&j);
            }
          }
        }
      }
LAB_00111f8f:
    }
    if (local_40 == (char *)0x0) {
      return 0;
    }
    uVar10 = hrec->type;
    uVar11 = uVar10 | iVar4 << 4 | local_50 << 8 | j << 0xc;
    pcVar8 = strdup(local_40);
    pkVar2 = (kh_vdict_t *)local_38->dict[0];
    kVar6 = kh_put_vdict(pkVar2,pcVar8,&ret);
    iVar4 = (int)lVar7;
    if (ret == 0) {
      free(pcVar8);
      pbVar3 = pkVar2->vals;
      uVar10 = uVar10 & 0xf;
      if (pbVar3[(int)kVar6].hrec[uVar10] != (bcf_hrec_t *)0x0) {
        return 0;
      }
      pbVar3[(int)kVar6].info[uVar10] = uVar11;
      pbVar3[(int)kVar6].hrec[uVar10] = hrec;
      if (iVar4 == -1) {
        hrec_add_idx(hrec,pkVar2->vals[(int)kVar6].id);
        return 1;
      }
      return 1;
    }
    pbVar3 = pkVar2->vals;
    pbVar3[(int)kVar6].hrec[2] = (bcf_hrec_t *)0x0;
    (pbVar3[(int)kVar6].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
    pbVar3[(int)kVar6].hrec[0] = (bcf_hrec_t *)0x0;
    pbVar3[(int)kVar6].hrec[1] = (bcf_hrec_t *)0x0;
    pbVar3 = pbVar3 + (int)kVar6;
    pbVar3->info[0] = 0xf;
    pbVar3->info[1] = 0xf;
    *(undefined8 *)(pbVar3->info + 2) = 0xf;
    pbVar3 = pkVar2->vals;
    pbVar3[(int)kVar6].info[uVar10 & 0xf] = uVar11;
    pbVar3[(int)kVar6].hrec[uVar10 & 0xf] = hrec;
    if (iVar4 == -1) {
      iVar4 = pkVar2->size - 1;
      pkVar2->vals[(int)kVar6].id = iVar4;
      hrec_add_idx(hrec,iVar4);
    }
    else {
      pkVar2->vals[(int)kVar6].id = iVar4;
    }
  }
  return 1;
}

Assistant:

int bcf_hdr_register_hrec(bcf_hdr_t *hdr, bcf_hrec_t *hrec)
{
    // contig
    int i,j,k, ret;
    char *str;
    if ( !strcmp(hrec->key, "contig") )
    {
        hrec->type = BCF_HL_CTG;

        // Get the contig ID ($str) and length ($j)
        i = bcf_hrec_find_key(hrec,"length");
        if ( i<0 ) j = 0;
        else if ( sscanf(hrec->vals[i],"%d",&j)!=1 ) return 0;

        i = bcf_hrec_find_key(hrec,"ID");
        if ( i<0 ) return 0;
        str = strdup(hrec->vals[i]);

        // Register in the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_CTG];
        k = kh_put(vdict, d, str, &ret);
        if ( !ret ) { free(str); return 0; }    // already present

        int idx = bcf_hrec_find_key(hrec,"IDX");
        if ( idx!=-1 )
        {
            char *tmp = hrec->vals[idx];
            idx = strtol(hrec->vals[idx], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else
        {
            idx = kh_size(d) - 1;
            hrec_add_idx(hrec, idx);
        }

        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = idx;
        kh_val(d, k).info[0] = j;
        kh_val(d, k).hrec[0] = hrec;

        return 1;
    }

    if ( !strcmp(hrec->key, "INFO") ) hrec->type = BCF_HL_INFO;
    else if ( !strcmp(hrec->key, "FILTER") ) hrec->type = BCF_HL_FLT;
    else if ( !strcmp(hrec->key, "FORMAT") ) hrec->type = BCF_HL_FMT;
    else if ( hrec->nkeys>0 ) { hrec->type = BCF_HL_STR; return 1; }
    else return 0;

    // INFO/FILTER/FORMAT
    char *id = NULL;
    int type = -1, num = -1, var = -1, idx = -1;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( !strcmp(hrec->keys[i], "ID") ) id = hrec->vals[i];
        else if ( !strcmp(hrec->keys[i], "IDX") )
        {
            char *tmp = hrec->vals[i];
            idx = strtol(hrec->vals[i], &tmp, 10);
            if ( *tmp )
            {
                fprintf(stderr,"[%s:%d %s] Error parsing the IDX tag, skipping.\n", __FILE__,__LINE__,__FUNCTION__);
                return 0;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Type") )
        {
            if ( !strcmp(hrec->vals[i], "Integer") ) type = BCF_HT_INT;
            else if ( !strcmp(hrec->vals[i], "Float") ) type = BCF_HT_REAL;
            else if ( !strcmp(hrec->vals[i], "String") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Character") ) type = BCF_HT_STR;
            else if ( !strcmp(hrec->vals[i], "Flag") ) type = BCF_HT_FLAG;
            else
            {
                fprintf(stderr, "[E::%s] The type \"%s\" not supported, assuming \"String\"\n", __func__, hrec->vals[i]);
                type = BCF_HT_STR;
            }
        }
        else if ( !strcmp(hrec->keys[i], "Number") )
        {
            if ( !strcmp(hrec->vals[i],"A") ) var = BCF_VL_A;
            else if ( !strcmp(hrec->vals[i],"R") ) var = BCF_VL_R;
            else if ( !strcmp(hrec->vals[i],"G") ) var = BCF_VL_G;
            else if ( !strcmp(hrec->vals[i],".") ) var = BCF_VL_VAR;
            else
            {
                sscanf(hrec->vals[i],"%d",&num);
                var = BCF_VL_FIXED;
            }
            if (var != BCF_VL_FIXED) num = 0xfffff;
        }
    }
    uint32_t info = (uint32_t)num<<12 | var<<8 | type<<4 | hrec->type;

    if ( !id ) return 0;
    str = strdup(id);

    vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_ID];
    k = kh_put(vdict, d, str, &ret);
    if ( !ret )
    {
        // already present
        free(str);
        if ( kh_val(d, k).hrec[info&0xf] ) return 0;
        kh_val(d, k).info[info&0xf] = info;
        kh_val(d, k).hrec[info&0xf] = hrec;
        if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);
        return 1;
    }
    kh_val(d, k) = bcf_idinfo_def;
    kh_val(d, k).info[info&0xf] = info;
    kh_val(d, k).hrec[info&0xf] = hrec;
    kh_val(d, k).id = idx==-1 ? kh_size(d) - 1 : idx;

    if ( idx==-1 ) hrec_add_idx(hrec, kh_val(d, k).id);

    return 1;
}